

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O1

void * ngx_hash_find(ngx_hash_t *hash,ngx_uint_t key,u_char *name,size_t len)

{
  void *pvVar1;
  ngx_hash_elt_t *pnVar2;
  size_t sVar3;
  
  pnVar2 = hash->buckets[key % hash->size];
  if (pnVar2 != (ngx_hash_elt_t *)0x0) {
    for (; pvVar1 = pnVar2->value, pvVar1 != (void *)0x0;
        pnVar2 = (ngx_hash_elt_t *)
                 ((ulong)(pnVar2[1].name + ((ulong)pnVar2->len - 9)) & 0xfffffffffffffff8)) {
      if (pnVar2->len == len) {
        if (len == 0) {
          return pvVar1;
        }
        sVar3 = 0;
        while (name[sVar3] == pnVar2->name[sVar3]) {
          sVar3 = sVar3 + 1;
          if (len == sVar3) {
            return pvVar1;
          }
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
ngx_hash_find(ngx_hash_t *hash, ngx_uint_t key, u_char *name, size_t len)
{
    ngx_uint_t       i;
    ngx_hash_elt_t  *elt;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "hf:\"%*s\"", len, name);
#endif

    elt = hash->buckets[key % hash->size];

    if (elt == NULL) {
        return NULL;
    }

    while (elt->value) {
        if (len != (size_t) elt->len) {
            goto next;
        }

        for (i = 0; i < len; i++) {
            if (name[i] != elt->name[i]) {
                goto next;
            }
        }

        return elt->value;

    next:

        elt = (ngx_hash_elt_t *) ngx_align_ptr(&elt->name[0] + elt->len,
                                               sizeof(void *));
        continue;
    }

    return NULL;
}